

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

Int32 Diligent::GetShaderTypePipelineIndex(SHADER_TYPE ShaderType,PIPELINE_TYPE PipelineType)

{
  bool bVar1;
  Char *pCVar2;
  char (*in_R8) [37];
  char **in_R9;
  undefined1 local_98 [8];
  string msg_2;
  string msg_1;
  char *local_48;
  Char *local_40;
  undefined1 local_38 [8];
  string msg;
  SHADER_TYPE local_10;
  PIPELINE_TYPE PipelineType_local;
  SHADER_TYPE ShaderType_local;
  
  msg.field_2._M_local_buf[0xf] = PipelineType;
  local_10 = ShaderType;
  bVar1 = IsConsistentShaderType(ShaderType,PipelineType);
  if (!bVar1) {
    local_40 = GetShaderTypeLiteralName(local_10);
    local_48 = GetPipelineTypeString(msg.field_2._M_local_buf[0xf]);
    in_R8 = (char (*) [37])&local_48;
    FormatString<char[13],char_const*,char[37],char_const*>
              ((string *)local_38,(Diligent *)"Shader type ",(char (*) [13])&local_40,
               (char **)" is inconsistent with pipeline type ",in_R8,in_R9);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetShaderTypePipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x898);
    std::__cxx11::string::~string((string *)local_38);
  }
  if ((local_10 != SHADER_TYPE_UNKNOWN) &&
     (bVar1 = IsPowerOfTwo<Diligent::SHADER_TYPE>(local_10), !bVar1)) {
    FormatString<char[39]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [39])"More than one shader type is specified");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"GetShaderTypePipelineIndex",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x899);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  if (local_10 == SHADER_TYPE_UNKNOWN) {
    return -1;
  }
  if (local_10 == SHADER_TYPE_VERTEX) {
    return 0;
  }
  if (local_10 == SHADER_TYPE_PIXEL) {
    return 4;
  }
  if (local_10 == SHADER_TYPE_GEOMETRY) {
    return 3;
  }
  if (local_10 == SHADER_TYPE_HULL) {
    return 1;
  }
  if (local_10 == SHADER_TYPE_DOMAIN) {
    return 2;
  }
  if ((local_10 != SHADER_TYPE_COMPUTE) && (local_10 != SHADER_TYPE_AMPLIFICATION)) {
    if (local_10 == SHADER_TYPE_MESH) {
      return 1;
    }
    if (local_10 != SHADER_TYPE_RAY_GEN) {
      if (local_10 == SHADER_TYPE_RAY_MISS) {
        return 1;
      }
      if (local_10 == SHADER_TYPE_RAY_CLOSEST_HIT) {
        return 2;
      }
      if (local_10 == SHADER_TYPE_RAY_ANY_HIT) {
        return 3;
      }
      if (local_10 == SHADER_TYPE_RAY_INTERSECTION) {
        return 4;
      }
      if (local_10 == SHADER_TYPE_CALLABLE) {
        return 5;
      }
      if (local_10 != SHADER_TYPE_LAST) {
        FormatString<char[25],Diligent::SHADER_TYPE,char[2]>
                  ((string *)local_98,(Diligent *)"Unexpected shader type (",
                   (char (*) [25])&local_10,(SHADER_TYPE *)0x46d916,(char (*) [2])in_R8);
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"GetShaderTypePipelineIndex",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
                   ,0x8bd);
        std::__cxx11::string::~string((string *)local_98);
        return -1;
      }
    }
  }
  return 0;
}

Assistant:

Int32 GetShaderTypePipelineIndex(SHADER_TYPE ShaderType, PIPELINE_TYPE PipelineType)
{
    VERIFY(IsConsistentShaderType(ShaderType, PipelineType), "Shader type ", GetShaderTypeLiteralName(ShaderType),
           " is inconsistent with pipeline type ", GetPipelineTypeString(PipelineType));
    VERIFY(ShaderType == SHADER_TYPE_UNKNOWN || IsPowerOfTwo(ShaderType), "More than one shader type is specified");

    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    switch (ShaderType)
    {
        case SHADER_TYPE_UNKNOWN:
            return -1;

        case SHADER_TYPE_VERTEX:        // Graphics
        case SHADER_TYPE_AMPLIFICATION: // Mesh
        case SHADER_TYPE_COMPUTE:       // Compute
        case SHADER_TYPE_RAY_GEN:       // Ray tracing
        case SHADER_TYPE_TILE:          // Tile
            return 0;

        case SHADER_TYPE_HULL:     // Graphics
        case SHADER_TYPE_MESH:     // Mesh
        case SHADER_TYPE_RAY_MISS: // RayTracing
            return 1;

        case SHADER_TYPE_DOMAIN:          // Graphics
        case SHADER_TYPE_RAY_CLOSEST_HIT: // Ray tracing
            return 2;

        case SHADER_TYPE_GEOMETRY:    // Graphics
        case SHADER_TYPE_RAY_ANY_HIT: // Ray tracing
            return 3;

        case SHADER_TYPE_PIXEL:            // Graphics or Mesh
        case SHADER_TYPE_RAY_INTERSECTION: // Ray tracing
            return 4;

        case SHADER_TYPE_CALLABLE: // RayTracing
            return 5;

        default:
            UNEXPECTED("Unexpected shader type (", ShaderType, ")");
            return -1;
    }
}